

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver_service.hpp
# Opt level: O0

void __thiscall
asio::detail::resolver_service<asio::ip::tcp>::
async_resolve<mau::ProxySession::Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)::__0>
          (resolver_service<asio::ip::tcp> *this,implementation_type *impl,query_type *query,
          anon_class_8_1_8991fb9c *handler)

{
  resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_tests_mau_MauProxy_cpp:531:13)>
  *this_00;
  weak_cancel_token_type *in_RCX;
  resolver_service_base *in_RDI;
  ptr p;
  operation *in_stack_ffffffffffffff88;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffffa0;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffffb0;
  io_context_impl *in_stack_ffffffffffffffb8;
  query_type *in_stack_ffffffffffffffc0;
  
  this_00 = resolve_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/tests/mau/MauProxy.cpp:531:13)>
            ::ptr::allocate(in_stack_ffffffffffffffa0);
  std::weak_ptr<void>::weak_ptr<void,void>
            ((weak_ptr<void> *)in_RDI,(shared_ptr<void> *)in_stack_ffffffffffffff88);
  resolve_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/tests/mau/MauProxy.cpp:531:13)>
  ::resolve_op(this_00,in_RCX,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0);
  std::weak_ptr<void>::~weak_ptr((weak_ptr<void> *)0x26ca89);
  resolver_service_base::start_resolve_op(in_RDI,in_stack_ffffffffffffff88);
  resolve_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/tests/mau/MauProxy.cpp:531:13)>
  ::ptr::~ptr((ptr *)0x26cab6);
  return;
}

Assistant:

void async_resolve(implementation_type& impl,
      const query_type& query, Handler& handler)
  {
    // Allocate and construct an operation to wrap the handler.
    typedef resolve_op<Protocol, Handler> op;
    typename op::ptr p = { asio::detail::addressof(handler),
      op::ptr::allocate(handler), 0 };
    p.p = new (p.v) op(impl, query, io_context_impl_, handler);

    ASIO_HANDLER_CREATION((io_context_impl_.context(),
          *p.p, "resolver", &impl, 0, "async_resolve"));

    start_resolve_op(p.p);
    p.v = p.p = 0;
  }